

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

TypeBase * AnalyzeType(ExpressionContext *ctx,SynBase *syntax,bool onlyType,bool *failed)

{
  __jmp_buf_tag *__env;
  long lVar1;
  _func_int **pp_Var2;
  SynBase *pSVar3;
  IntrusiveList<TypeHandle> generics;
  IntrusiveList<TypeHandle> arguments;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  TypeBase *pTVar10;
  TypeGenericAlias *pTVar11;
  SynBase **ppSVar12;
  TypeBase *pTVar13;
  undefined4 extraout_var;
  TypeRef *pTVar14;
  ExprBase *pEVar15;
  TypeHandle *pTVar16;
  ScopeData *pSVar17;
  TypeGenericClassProto *proto;
  undefined4 extraout_var_00;
  TypeGenericClass *pTVar18;
  TypeUnsizedArray *pTVar19;
  TypeFunction *pTVar20;
  TypeArray *pTVar21;
  char *pcVar22;
  byte bVar23;
  SynTypeAlias *node;
  IntrusiveList<TypeHandle> types;
  jmp_buf prevErrorHandler;
  
  if (syntax == (SynBase *)0x0) goto LAB_0015ffbe;
  uVar5 = syntax->typeID;
  switch(uVar5) {
  case 5:
    return ctx->typeAuto;
  case 6:
    goto switchD_0015f9d7_caseD_6;
  case 7:
  case 0xc:
    break;
  case 8:
    pTVar11 = ExpressionContext::GetGenericAliasType(ctx,(SynIdentifier *)syntax[1]._vptr_SynBase);
    return &pTVar11->super_TypeBase;
  case 9:
    pTVar10 = AnalyzeType(ctx,(SynBase *)syntax[1]._vptr_SynBase,onlyType,failed);
    if (pTVar10 == (TypeBase *)0x0 && !onlyType) {
      return (TypeBase *)0x0;
    }
    if ((pTVar10 == (TypeBase *)0x0) || (pTVar10->typeID != 0)) {
      pTVar10 = ApplyArraySizesToType(ctx,pTVar10,*(SynBase **)&syntax[1].typeID);
      return pTVar10;
    }
    goto LAB_00160222;
  case 10:
    pTVar10 = AnalyzeType(ctx,(SynBase *)syntax[1]._vptr_SynBase,true,failed);
    if (pTVar10 != (TypeBase *)0x0) {
      if (pTVar10->typeID == 0) goto LAB_00160222;
      if (pTVar10->typeID == 0xe) {
        return &ctx->typeAutoRef->super_TypeBase;
      }
    }
    bVar4 = AssertResolvableType(ctx,syntax,pTVar10,true);
    if (bVar4) {
      pTVar14 = ExpressionContext::GetReferenceType(ctx,pTVar10);
      return &pTVar14->super_TypeBase;
    }
    goto LAB_00160222;
  case 0xb:
    pTVar10 = AnalyzeType(ctx,(SynBase *)syntax[1]._vptr_SynBase,onlyType,failed);
    if (pTVar10 == (TypeBase *)0x0 && !onlyType) {
      return (TypeBase *)0x0;
    }
    if (((pTVar10 == (TypeBase *)0x0) || (pTVar10->typeID != 0)) &&
       (bVar4 = AssertResolvableType(ctx,syntax,pTVar10,true), bVar4)) {
      if (pTVar10 == ctx->typeAuto) {
        pcVar22 = "ERROR: return type of a function type cannot be auto";
      }
      else {
        prevErrorHandler[0].__jmpbuf[0] = 0;
        prevErrorHandler[0].__jmpbuf[1] = 0;
        ppSVar12 = (SynBase **)&syntax[1].typeID;
        while( true ) {
          pSVar3 = *ppSVar12;
          if (pSVar3 == (SynBase *)0x0) {
            arguments.tail = (TypeHandle *)prevErrorHandler[0].__jmpbuf[1];
            arguments.head = (TypeHandle *)prevErrorHandler[0].__jmpbuf[0];
            pTVar20 = ExpressionContext::GetFunctionType(ctx,syntax,pTVar10,arguments);
            return &pTVar20->super_TypeBase;
          }
          pTVar13 = AnalyzeType(ctx,pSVar3,onlyType,failed);
          if (!onlyType && pTVar13 == (TypeBase *)0x0) {
            return (TypeBase *)0x0;
          }
          if (((pTVar13 != (TypeBase *)0x0) && (pTVar13->typeID == 0)) ||
             (bVar4 = AssertResolvableType(ctx,syntax,pTVar13,true), !bVar4)) goto LAB_00160222;
          if (pTVar13 == ctx->typeAuto) break;
          if (pTVar13 == ctx->typeVoid) {
            pcVar22 = "ERROR: function argument cannot be a void type";
            goto LAB_00160363;
          }
          iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
          pTVar16 = (TypeHandle *)CONCAT44(extraout_var,iVar9);
          pTVar16->type = pTVar13;
          pTVar16->next = (TypeHandle *)0x0;
          pTVar16->listed = false;
          IntrusiveList<TypeHandle>::push_back
                    ((IntrusiveList<TypeHandle> *)prevErrorHandler,pTVar16);
          ppSVar12 = &pSVar3->next;
        }
        pcVar22 = "ERROR: function argument cannot be an auto type";
      }
      goto LAB_00160363;
    }
    goto LAB_00160222;
  case 0xd:
    __env = ctx->errorHandler;
    memcpy(prevErrorHandler,__env,200);
    bVar4 = ctx->errorHandlerNested;
    ctx->errorHandlerNested = true;
    pcVar22 = ctx->errorBuf;
    uVar5 = ctx->errorBufSize;
    if (failed != (bool *)0x0) {
      ctx->errorBuf = (char *)0x0;
      ctx->errorBufSize = 0;
    }
    pSVar17 = ctx->scope;
    uVar6 = *(uint *)(NULLC::traceContext + 0x244);
    iVar9 = _setjmp((__jmp_buf_tag *)__env);
    if (iVar9 != 0) {
      NULLC::TraceLeaveTo(uVar6);
      if (ctx->scope != pSVar17) {
        ctx->scope = pSVar17;
        ctx->lookupLocation = (SynBase *)0x0;
      }
      memcpy(__env,prevErrorHandler,200);
      ctx->errorHandlerNested = bVar4;
      ctx->errorBuf = pcVar22;
      ctx->errorBufSize = uVar5;
      if (failed == (bool *)0x0) {
        longjmp((__jmp_buf_tag *)__env,1);
      }
      *failed = true;
      return ctx->typeGeneric;
    }
    pTVar10 = AnalyzeType(ctx,(SynBase *)syntax[1]._vptr_SynBase,false,(bool *)0x0);
    if (pTVar10 == (TypeBase *)0x0) {
      pEVar15 = AnalyzeExpression(ctx,(SynBase *)syntax[1]._vptr_SynBase);
      if (pEVar15->type == ctx->typeAuto) {
        pcVar22 = "ERROR: cannot take typeid from auto type";
        goto LAB_00160363;
      }
      AssertValueExpression(ctx,syntax,pEVar15);
      pTVar10 = pEVar15->type;
    }
    memcpy(__env,prevErrorHandler,200);
    ctx->errorHandlerNested = bVar4;
    ctx->errorBuf = pcVar22;
    ctx->errorBufSize = uVar5;
    if (pTVar10 != (TypeBase *)0x0) {
      bVar4 = AssertResolvableType(ctx,(SynBase *)syntax[1]._vptr_SynBase,pTVar10,false);
      if (!bVar4) {
        pTVar10 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        return pTVar10;
      }
      return pTVar10;
    }
    uVar5 = syntax->typeID;
    break;
  default:
    if (uVar5 == 0x19) {
      pTVar10 = AnalyzeType(ctx,(SynBase *)syntax[1]._vptr_SynBase,onlyType,failed);
      if (pTVar10 == (TypeBase *)0x0 && !onlyType) {
        return (TypeBase *)0x0;
      }
      if (pTVar10 != (TypeBase *)0x0) {
        uVar5 = pTVar10->typeID;
        if (uVar5 == 0) goto LAB_00160222;
        if (uVar5 == 0xe) {
          if (*(long *)&syntax[1].typeID == 0) {
            return &ctx->typeAutoArray->super_TypeBase;
          }
          pcVar22 = "ERROR: cannot specify array size for auto";
          goto LAB_00160363;
        }
        if (uVar5 == 1) {
          anon_unknown.dwarf_b837c::Report(ctx,syntax,"ERROR: cannot define an array of \'void\'");
          goto LAB_00160222;
        }
      }
      if (*(long *)&syntax[1].typeID == 0) {
        if (pTVar10->size < 0x10000) {
          bVar4 = AssertResolvableType(ctx,syntax,pTVar10,true);
          if (bVar4) {
            pTVar19 = ExpressionContext::GetUnsizedArrayType(ctx,pTVar10);
            return (TypeBase *)pTVar19;
          }
          goto LAB_00160222;
        }
        pcVar22 = "ERROR: array element size cannot exceed 65535 bytes";
        goto LAB_00160363;
      }
      uVar5 = IntrusiveList<SynCallArgument>::size
                        ((IntrusiveList<SynCallArgument> *)&syntax[1].typeID);
      if (1 < uVar5) {
        pcVar22 = "ERROR: \',\' is not expected in array type size";
        goto LAB_00160363;
      }
      lVar1 = *(long *)&syntax[1].typeID;
      if (*(long *)(lVar1 + 0x40) != 0) {
        pcVar22 = "ERROR: named argument not expected in array type size";
        goto LAB_00160363;
      }
      pEVar15 = AnalyzeExpression(ctx,*(SynBase **)(lVar1 + 0x48));
      if ((pEVar15->type != (TypeBase *)0x0) && (pEVar15->type->typeID == 0)) goto LAB_00160222;
      pEVar15 = CreateCast(ctx,syntax,pEVar15,ctx->typeLong,false);
      pEVar15 = anon_unknown.dwarf_b837c::EvaluateExpression(ctx,syntax,pEVar15);
      if ((pEVar15 == (ExprBase *)0x0) || (pEVar15->typeID != 6)) {
        if (!onlyType) {
          return (TypeBase *)0x0;
        }
        pcVar22 = "ERROR: index must be a constant expression";
        goto LAB_00160363;
      }
      if (pTVar10 == (TypeBase *)0x0) {
        if ((long)pEVar15[1]._vptr_ExprBase < 1) {
LAB_001603ea:
          pcVar22 = "ERROR: array size can\'t be negative or zero";
          goto LAB_00160363;
        }
      }
      else {
        pp_Var2 = pEVar15[1]._vptr_ExprBase;
        if (pTVar10->typeID == 0x1b) {
          if ((long)pp_Var2 < 0) {
            pcVar22 = "ERROR: argument index can\'t be negative";
          }
          else {
            if (pTVar10[1]._vptr_TypeBase != (_func_int **)0x0) {
              pTVar13 = pTVar10 + 1;
              uVar5 = IntrusiveList<TypeHandle>::size((IntrusiveList<TypeHandle> *)pTVar13);
              if ((_func_int **)(ulong)uVar5 <= pp_Var2) {
                iVar9 = *(int *)&(pTVar10->name).end;
                pcVar22 = (pTVar10->name).begin;
                uVar5 = IntrusiveList<TypeHandle>::size((IntrusiveList<TypeHandle> *)pTVar13);
                anon_unknown.dwarf_b837c::Stop
                          (ctx,syntax,"ERROR: this function type \'%.*s\' has only %d argument(s)",
                           (ulong)(uint)(iVar9 - (int)pcVar22),pcVar22,(ulong)uVar5);
              }
              pTVar16 = IntrusiveList<TypeHandle>::operator[]
                                  ((IntrusiveList<TypeHandle> *)pTVar13,
                                   *(uint *)&pEVar15[1]._vptr_ExprBase);
              return pTVar16->type;
            }
            pcVar22 = "ERROR: function argument set is empty";
          }
          goto LAB_00160363;
        }
        if ((long)pp_Var2 < 1) goto LAB_001603ea;
        if ((pTVar10->typeID == 0x18) && (*(char *)((long)&pTVar10[3]._vptr_TypeBase + 2) == '\x01')
           ) {
          uVar5 = *(int *)&(pTVar10->name).end - (int)(pTVar10->name).begin;
          pcVar22 = 
          "ERROR: class \'%.*s\' implements \'finalize\' so only an unsized array type can be created"
          ;
          goto LAB_00160065;
        }
      }
      if (pTVar10->size < 0x10000) {
        bVar4 = AssertResolvableType(ctx,syntax,pTVar10,true);
        if (bVar4) {
          pTVar21 = ExpressionContext::GetArrayType(ctx,pTVar10,(longlong)pEVar15[1]._vptr_ExprBase)
          ;
          return &pTVar21->super_TypeBase;
        }
        goto LAB_00160222;
      }
      pcVar22 = "ERROR: array element size cannot exceed 65535 bytes";
      goto LAB_00160363;
    }
  }
  if (uVar5 != 0) {
    if (uVar5 == 0x17) {
      pTVar10 = AnalyzeType(ctx,(SynBase *)syntax[1]._vptr_SynBase,onlyType,failed);
      if (pTVar10 != (TypeBase *)0x0 || onlyType) {
        if (pTVar10 != (TypeBase *)0x0) {
          if (pTVar10->typeID == 0) goto LAB_00160222;
          if (pTVar10->typeID == 0xc) {
switchD_0015f9d7_caseD_6:
            return ctx->typeGeneric;
          }
        }
        pEVar15 = CreateTypeidMemberAccess(ctx,syntax,pTVar10,*(SynIdentifier **)&syntax[1].typeID);
        if ((pEVar15 != (ExprBase *)0x0) && (pEVar15->typeID == 8)) {
          return (TypeBase *)pEVar15[1]._vptr_ExprBase;
        }
        if (onlyType) {
          pcVar22 = "ERROR: typeof expression result is not a type";
          goto LAB_00160363;
        }
      }
      return (TypeBase *)0x0;
    }
    if (uVar5 == 0xc) {
      proto = (TypeGenericClassProto *)
              AnalyzeType(ctx,(SynBase *)syntax[1]._vptr_SynBase,true,failed);
      if (proto != (TypeGenericClassProto *)0x0) {
        uVar5 = (proto->super_TypeBase).typeID;
        if (uVar5 == 0x16) {
          prevErrorHandler[0].__jmpbuf[0] = (long)(proto->definition->aliases).head;
          prevErrorHandler[0].__jmpbuf[1] = (long)(proto->definition->aliases).tail;
          ppSVar12 = (SynBase **)&syntax[1].typeID;
          uVar5 = IntrusiveList<SynBase>::size((IntrusiveList<SynBase> *)ppSVar12);
          uVar6 = IntrusiveList<SynIdentifier>::size
                            ((IntrusiveList<SynIdentifier> *)prevErrorHandler);
          uVar7 = IntrusiveList<SynBase>::size((IntrusiveList<SynBase> *)ppSVar12);
          uVar8 = IntrusiveList<SynIdentifier>::size
                            ((IntrusiveList<SynIdentifier> *)prevErrorHandler);
          if (uVar5 < uVar6) {
            pcVar22 = 
            "ERROR: there where only \'%d\' argument(s) to a generic type that expects \'%d\'";
          }
          else {
            if (uVar7 <= uVar8) {
              types.head = (TypeHandle *)0x0;
              types.tail = (TypeHandle *)0x0;
              bVar23 = 0;
              while( true ) {
                pSVar3 = *ppSVar12;
                if (pSVar3 == (SynBase *)0x0) {
                  if ((bVar23 & 1) == 0) {
                    pTVar10 = CreateGenericTypeInstance(ctx,syntax,proto,&types);
                    return pTVar10;
                  }
                  generics.tail = types.tail;
                  generics.head = types.head;
                  pTVar18 = ExpressionContext::GetGenericClassType(ctx,syntax,proto,generics);
                  return &pTVar18->super_TypeBase;
                }
                pTVar10 = AnalyzeType(ctx,pSVar3,true,failed);
                if (pTVar10 == ctx->typeAuto) break;
                if ((pTVar10 != (TypeBase *)0x0) && (pTVar10->typeID == 0)) goto LAB_00160222;
                bVar23 = bVar23 | pTVar10->isGeneric;
                iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
                pTVar16 = (TypeHandle *)CONCAT44(extraout_var_00,iVar9);
                pTVar16->type = pTVar10;
                pTVar16->next = (TypeHandle *)0x0;
                pTVar16->listed = false;
                IntrusiveList<TypeHandle>::push_back(&types,pTVar16);
                ppSVar12 = &pSVar3->next;
              }
              pcVar22 = "ERROR: \'auto\' type cannot be used as template argument";
              goto LAB_00160363;
            }
            uVar7 = IntrusiveList<SynIdentifier>::size
                              ((IntrusiveList<SynIdentifier> *)prevErrorHandler);
            uVar8 = IntrusiveList<SynBase>::size((IntrusiveList<SynBase> *)ppSVar12);
            pcVar22 = "ERROR: type has only \'%d\' generic argument(s) while \'%d\' specified";
          }
          anon_unknown.dwarf_b837c::Stop(ctx,syntax,pcVar22,(ulong)uVar7,(ulong)uVar8);
        }
        if (uVar5 == 0) goto LAB_00160222;
      }
      uVar5 = *(int *)&(proto->super_TypeBase).name.end - (int)(proto->super_TypeBase).name.begin;
      pcVar22 = "ERROR: type \'%.*s\' can\'t have generic arguments";
LAB_00160065:
      anon_unknown.dwarf_b837c::Stop(ctx,syntax,pcVar22,(ulong)uVar5);
    }
    if (uVar5 != 7) {
LAB_0015ffbe:
      if (!onlyType) {
        return (TypeBase *)0x0;
      }
      pcVar22 = "ERROR: unknown type";
LAB_00160363:
      anon_unknown.dwarf_b837c::Stop(ctx,syntax,pcVar22);
    }
    pSVar17 = anon_unknown.dwarf_b837c::NamedOrGlobalScopeFrom((ScopeData *)(ulong)uVar5);
    while (pTVar10 = (TypeBase *)0x0, pSVar17 != (ScopeData *)0x0) {
      if (pSVar17->ownerNamespace == (NamespaceData *)0x0) {
        uVar5 = NULLC::GetStringHash("");
      }
      else {
        uVar5 = NULLC::StringHashContinue(pSVar17->ownerNamespace->fullNameHash,".");
      }
      pTVar10 = (TypeBase *)syntax[1]._vptr_SynBase;
      while (pTVar10 != (TypeBase *)0x0) {
        uVar5 = NULLC::StringHashContinue
                          (uVar5,(char *)pTVar10->refType,(char *)(pTVar10->arrayTypes).head);
        uVar5 = NULLC::StringHashContinue(uVar5,".");
        pTVar10 = (TypeBase *)pTVar10->size;
        if ((pTVar10 == (TypeBase *)0x0) || (pTVar10->typeID != 4)) {
          pTVar10 = (TypeBase *)0x0;
        }
      }
      uVar5 = NULLC::StringHashContinue(uVar5,(char *)syntax[1].begin,(char *)syntax[1].end);
      pTVar10 = anon_unknown.dwarf_b837c::LookupTypeByName(ctx,uVar5);
      if (pTVar10 != (TypeBase *)0x0) break;
      pSVar17 = anon_unknown.dwarf_b837c::NamedOrGlobalScopeFrom((ScopeData *)0x0);
    }
    if (!onlyType || pSVar17 != (ScopeData *)0x0) {
      return pTVar10;
    }
    anon_unknown.dwarf_b837c::Report
              (ctx,syntax,"ERROR: \'%.*s\' is not a known type name",
               (ulong)(uint)(*(int *)&syntax[1].end - (int)syntax[1].begin));
  }
LAB_00160222:
  pTVar10 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
  return pTVar10;
}

Assistant:

TypeBase* AnalyzeType(ExpressionContext &ctx, SynBase *syntax, bool onlyType = true, bool *failed = NULL)
{
	if(isType<SynTypeAuto>(syntax))
	{
		return ctx.typeAuto;
	}

	if(isType<SynTypeGeneric>(syntax))
	{
		return ctx.typeGeneric;
	}

	if(SynTypeAlias *node = getType<SynTypeAlias>(syntax))
	{
		return ctx.GetGenericAliasType(node->name);
	}

	if(SynTypeReference *node = getType<SynTypeReference>(syntax))
	{
		TypeBase *type = AnalyzeType(ctx, node->type, true, failed);

		if(isType<TypeAuto>(type))
			return ctx.typeAutoRef;

		if(isType<TypeError>(type))
			return ctx.GetErrorType();

		if(!AssertResolvableType(ctx, syntax, type, true))
			return ctx.GetErrorType();

		return ctx.GetReferenceType(type);
	}

	if(SynTypeArray *node = getType<SynTypeArray>(syntax))
	{
		TypeBase *type = AnalyzeType(ctx, node->type, onlyType, failed);

		if(!onlyType && !type)
			return NULL;

		if(isType<TypeError>(type))
			return ctx.GetErrorType();

		return ApplyArraySizesToType(ctx, type, node->sizes.head);
	}

	if(SynArrayIndex *node = getType<SynArrayIndex>(syntax))
	{
		TypeBase *type = AnalyzeType(ctx, node->value, onlyType, failed);

		if(!onlyType && !type)
			return NULL;

		if(isType<TypeVoid>(type))
		{
			Report(ctx, syntax, "ERROR: cannot define an array of 'void'");

			return ctx.GetErrorType();
		}

		if(isType<TypeAuto>(type))
		{
			if(!node->arguments.empty())
				Stop(ctx, syntax, "ERROR: cannot specify array size for auto");

			return ctx.typeAutoArray;
		}

		if(isType<TypeError>(type))
			return ctx.GetErrorType();

		if(node->arguments.empty())
		{
			if(type->size >= 64 * 1024)
				Stop(ctx, syntax, "ERROR: array element size cannot exceed 65535 bytes");

			if(!AssertResolvableType(ctx, syntax, type, true))
				return ctx.GetErrorType();

			return ctx.GetUnsizedArrayType(type);
		}

		if(node->arguments.size() > 1)
			Stop(ctx, syntax, "ERROR: ',' is not expected in array type size");

		SynCallArgument *argument = node->arguments.head;

		if(argument->name)
			Stop(ctx, syntax, "ERROR: named argument not expected in array type size");

		ExprBase *size = AnalyzeExpression(ctx, argument->value);

		if(isType<TypeError>(size->type))
			return ctx.GetErrorType();

		if(ExprIntegerLiteral *number = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, syntax, CreateCast(ctx, node, size, ctx.typeLong, false))))
		{
			if(TypeArgumentSet *lhs = getType<TypeArgumentSet>(type))
			{
				if(number->value < 0)
					Stop(ctx, syntax, "ERROR: argument index can't be negative");

				if(lhs->types.empty())
					Stop(ctx, syntax, "ERROR: function argument set is empty");

				if(number->value >= lhs->types.size())
					Stop(ctx, syntax, "ERROR: this function type '%.*s' has only %d argument(s)", FMT_ISTR(type->name), lhs->types.size());

				return lhs->types[unsigned(number->value)]->type;
			}

			if(number->value <= 0)
				Stop(ctx, syntax, "ERROR: array size can't be negative or zero");

			if(TypeClass *typeClass = getType<TypeClass>(type))
			{
				if(typeClass->hasFinalizer)
					Stop(ctx, syntax, "ERROR: class '%.*s' implements 'finalize' so only an unsized array type can be created", FMT_ISTR(type->name));
			}

			if(type->size >= 64 * 1024)
				Stop(ctx, syntax, "ERROR: array element size cannot exceed 65535 bytes");

			if(!AssertResolvableType(ctx, syntax, type, true))
				return ctx.GetErrorType();

			return ctx.GetArrayType(type, number->value);
		}

		if(!onlyType)
			return NULL;

		Stop(ctx, syntax, "ERROR: index must be a constant expression");
	}

	if(SynTypeFunction *node = getType<SynTypeFunction>(syntax))
	{
		TypeBase *returnType = AnalyzeType(ctx, node->returnType, onlyType, failed);

		if(!onlyType && !returnType)
			return NULL;

		if(isType<TypeError>(returnType))
			return ctx.GetErrorType();

		if(!AssertResolvableType(ctx, syntax, returnType, true))
			return ctx.GetErrorType();

		if(returnType == ctx.typeAuto)
			Stop(ctx, syntax, "ERROR: return type of a function type cannot be auto");

		IntrusiveList<TypeHandle> arguments;

		for(SynBase *el = node->arguments.head; el; el = el->next)
		{
			TypeBase *argType = AnalyzeType(ctx, el, onlyType, failed);

			if(!onlyType && !argType)
				return NULL;

			if(isType<TypeError>(argType))
				return ctx.GetErrorType();

			if(!AssertResolvableType(ctx, syntax, argType, true))
				return ctx.GetErrorType();

			if(argType == ctx.typeAuto)
				Stop(ctx, syntax, "ERROR: function argument cannot be an auto type");

			if(argType == ctx.typeVoid)
				Stop(ctx, syntax, "ERROR: function argument cannot be a void type");

			arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(argType));
		}

		return ctx.GetFunctionType(syntax, returnType, arguments);
	}

	if(SynTypeof *node = getType<SynTypeof>(syntax))
	{
		jmp_buf prevErrorHandler;
		memcpy(&prevErrorHandler, &ctx.errorHandler, sizeof(jmp_buf));

		bool prevErrorHandlerNested = ctx.errorHandlerNested;
		ctx.errorHandlerNested = true;

		char *errorBuf = ctx.errorBuf;
		unsigned errorBufSize = ctx.errorBufSize;

		if(failed)
		{
			ctx.errorBuf = 0;
			ctx.errorBufSize = 0;
		}

		// Remember current scope
		ScopeData *scope = ctx.scope;

		unsigned traceDepth = NULLC::TraceGetDepth();

		if(!setjmp(ctx.errorHandler))
		{
			TypeBase *type = AnalyzeType(ctx, node->value, false);

			if(!type)
			{
				ExprBase *value = AnalyzeExpression(ctx, node->value);

				if(value->type == ctx.typeAuto)
					Stop(ctx, syntax, "ERROR: cannot take typeid from auto type");

				AssertValueExpression(ctx, syntax, value);

				type = value->type;
			}

			memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
			ctx.errorHandlerNested = prevErrorHandlerNested;

			ctx.errorBuf = errorBuf;
			ctx.errorBufSize = errorBufSize;

			if(type)
			{
				if(!AssertResolvableType(ctx, node->value, type, false))
					return ctx.GetErrorType();

				return type;
			}
		}
		else
		{
			NULLC::TraceLeaveTo(traceDepth);

			// Restore original scope
			if(ctx.scope != scope)
				ctx.SwitchToScopeAtPoint(scope, NULL);

			memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
			ctx.errorHandlerNested = prevErrorHandlerNested;

			ctx.errorBuf = errorBuf;
			ctx.errorBufSize = errorBufSize;

			if(failed)
			{
				*failed = true;
				return ctx.typeGeneric;
			}

			longjmp(ctx.errorHandler, 1);
		}
	}

	if(SynTypeSimple *node = getType<SynTypeSimple>(syntax))
	{
		for(ScopeData *nsScope = NamedOrGlobalScopeFrom(ctx.scope); nsScope; nsScope = NamedOrGlobalScopeFrom(nsScope->scope))
		{
			unsigned hash = nsScope->ownerNamespace ? NULLC::StringHashContinue(nsScope->ownerNamespace->fullNameHash, ".") : NULLC::GetStringHash("");

			for(SynIdentifier *part = node->path.head; part; part = getType<SynIdentifier>(part->next))
			{
				hash = NULLC::StringHashContinue(hash, part->name.begin, part->name.end);
				hash = NULLC::StringHashContinue(hash, ".");
			}

			hash = NULLC::StringHashContinue(hash, node->name.begin, node->name.end);

			TypeBase *type = LookupTypeByName(ctx, hash);

			if(type)
				return type;
		}

		// Might be a variable
		if(!onlyType)
			return NULL;

		Report(ctx, syntax, "ERROR: '%.*s' is not a known type name", FMT_ISTR(node->name));

		return ctx.GetErrorType();
	}

	if(SynMemberAccess *node = getType<SynMemberAccess>(syntax))
	{
		TypeBase *value = AnalyzeType(ctx, node->value, onlyType, failed);

		if(!onlyType && !value)
			return NULL;

		if(isType<TypeGeneric>(value))
			return ctx.typeGeneric;

		if(isType<TypeError>(value))
			return ctx.GetErrorType();

		ExprBase *result = CreateTypeidMemberAccess(ctx, syntax, value, node->member);

		if(ExprTypeLiteral *typeLiteral = getType<ExprTypeLiteral>(result))
			return typeLiteral->value;

		// [n]

		if(!onlyType)
			return NULL;

		// isReference/isArray/isFunction/arraySize/hasMember(x)/class member/class typedef

		Stop(ctx, syntax, "ERROR: typeof expression result is not a type");

		return NULL;
	}

	if(SynTypeGenericInstance *node = getType<SynTypeGenericInstance>(syntax))
	{
		TypeBase *baseType = AnalyzeType(ctx, node->baseType, true, failed);

		if(isType<TypeError>(baseType))
			return ctx.GetErrorType();

		// TODO: overloads with a different number of generic arguments

		if(TypeGenericClassProto *proto = getType<TypeGenericClassProto>(baseType))
		{
			IntrusiveList<SynIdentifier> aliases = proto->definition->aliases;

			if(node->types.size() < aliases.size())
				Stop(ctx, syntax, "ERROR: there where only '%d' argument(s) to a generic type that expects '%d'", node->types.size(), aliases.size());

			if(node->types.size() > aliases.size())
				Stop(ctx, syntax, "ERROR: type has only '%d' generic argument(s) while '%d' specified", aliases.size(), node->types.size());

			bool isGeneric = false;
			IntrusiveList<TypeHandle> types;

			for(SynBase *el = node->types.head; el; el = el->next)
			{
				TypeBase *type = AnalyzeType(ctx, el, true, failed);

				if(type == ctx.typeAuto)
					Stop(ctx, syntax, "ERROR: 'auto' type cannot be used as template argument");

				if(isType<TypeError>(type))
					return ctx.GetErrorType();

				isGeneric |= type->isGeneric;

				types.push_back(new (ctx.get<TypeHandle>()) TypeHandle(type));
			}

			if(isGeneric)
				return ctx.GetGenericClassType(syntax, proto, types);
			
			return CreateGenericTypeInstance(ctx, syntax, proto, types);
		}

		Stop(ctx, syntax, "ERROR: type '%.*s' can't have generic arguments", FMT_ISTR(baseType->name));
	}

	if(isType<SynError>(syntax))
		return ctx.GetErrorType();

	if(!onlyType)
		return NULL;

	Stop(ctx, syntax, "ERROR: unknown type");

	return NULL;
}